

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::clicked(QColumnViewPrivate *this,QModelIndex *index)

{
  QAbstractItemView *this_00;
  byte bVar1;
  pointer ppQVar2;
  QItemSelectionModel *pQVar3;
  QModelIndex *pQVar4;
  int column;
  ulong uVar5;
  QAbstractItemView *this_01;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_58,index);
  this_01 = (QAbstractItemView *)0x0;
  uVar5 = 0;
  do {
    if ((ulong)(this->columns).d.size <= uVar5) {
LAB_0050b0f0:
      pQVar3 = QAbstractItemView::selectionModel(this_00);
      if ((pQVar3 != (QItemSelectionModel *)0x0) && (this_01 != (QAbstractItemView *)0x0)) {
        pQVar4 = (QModelIndex *)QAbstractItemView::selectionModel(this_01);
        bVar1 = QItemSelectionModel::isSelected(pQVar4);
        pQVar3 = QAbstractItemView::selectionModel(this_00);
        (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,index,(uint)bVar1 * 2 + 0x10);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    QAbstractItemView::rootIndex(&local_70,(QAbstractItemView *)(this->columns).d.ptr[uVar5]);
    if ((((local_70.r == (int)local_58) && (local_70.c == local_58._4_4_)) &&
        ((undefined1 *)local_70.i == puStack_50)) && (local_70.m.ptr == local_48.ptr)) {
      ppQVar2 = QList<QAbstractItemView_*>::data(&this->columns);
      this_01 = (QAbstractItemView *)ppQVar2[uVar5];
      goto LAB_0050b0f0;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void QColumnViewPrivate::clicked(const QModelIndex &index)
{
    Q_Q(QColumnView);
    QModelIndex parent = index.parent();
    QAbstractItemView *columnClicked = nullptr;
    for (int column = 0; column < columns.size(); ++column) {
        if (columns.at(column)->rootIndex() == parent) {
            columnClicked = columns[column];
            break;
        }
    }
    if (q->selectionModel() && columnClicked) {
        QItemSelectionModel::SelectionFlags flags = QItemSelectionModel::Current;
        if (columnClicked->selectionModel()->isSelected(index))
            flags |= QItemSelectionModel::Select;
        q->selectionModel()->setCurrentIndex(index, flags);
    }
}